

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_proxy_call(JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,
                     int flags)

{
  int iVar1;
  JSValue new_target;
  JSValue new_target_00;
  JSValue new_target_01;
  JSValueUnion *pJVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  uint uVar5;
  ulong uVar6;
  JSValue func_obj_00;
  JSValue v;
  JSValue func_obj_01;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue method;
  ulong local_90;
  JSValueUnion local_80;
  int64_t local_78;
  JSValueUnion local_70;
  JSValueUnion local_68;
  JSValueUnion JStack_60;
  JSValue local_58;
  JSValue local_48;
  
  if ((flags & 1U) == 0) {
    pJVar2 = (JSValueUnion *)get_proxy_method(ctx,(JSValue *)&local_80,func_obj,0x5a);
    if (pJVar2 == (JSValueUnion *)0x0) {
      JVar7 = (JSValue)(ZEXT816(6) << 0x40);
      uVar6 = 0;
    }
    else {
      uVar5 = (uint)local_78;
      if (*(uint8_t *)(pJVar2 + 4) == '\0') {
        local_68.float64 = local_80.float64;
        if ((0xfffffff4 < uVar5) &&
           (iVar1 = *local_80.ptr, *(int *)local_80.ptr = iVar1 + -1, iVar1 < 2)) {
          JVar9.tag = local_78;
          JVar9.u.ptr = local_80.ptr;
          __JS_FreeValueRT(ctx->rt,JVar9);
        }
        JS_ThrowTypeError(ctx,"not a function");
        uVar6 = 0;
        JVar7 = (JSValue)(ZEXT816(6) << 0x40);
      }
      else if (uVar5 == 3) {
        local_68.float64 = local_68.float64 & 0xffffffff00000000;
        JStack_60 = (JSValueUnion)0x3;
        new_target.tag._0_4_ = 3;
        new_target.u.ptr = local_68.ptr;
        new_target.tag._4_4_ = 0;
        JVar7 = JS_CallInternal(ctx,*(JSValue *)pJVar2,this_obj,new_target,argc,argv,2);
        uVar6 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
      }
      else {
        JVar9 = js_create_array(ctx,argc,argv);
        if ((uint)JVar9.tag == 6) {
          JVar7 = (JSValue)(ZEXT816(6) << 0x40);
          uVar6 = 0;
        }
        else {
          local_68 = *pJVar2;
          JStack_60 = pJVar2[1];
          local_90 = local_90 & 0xffffffff00000000;
          new_target_00.tag._0_4_ = 3;
          new_target_00.u.ptr = (void *)local_90;
          new_target_00.tag._4_4_ = 0;
          func_obj_00.tag = local_78;
          func_obj_00.u.ptr = local_80.ptr;
          local_58 = this_obj;
          local_48 = JVar9;
          JVar7 = JS_CallInternal(ctx,func_obj_00,*(JSValue *)(pJVar2 + 2),new_target_00,3,
                                  (JSValue *)&local_68,2);
          uVar6 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
        }
        if ((0xfffffff4 < uVar5) &&
           (iVar1 = *local_80.ptr, *(int *)local_80.ptr = iVar1 + -1, iVar1 < 2)) {
          v.tag = local_78;
          v.u.ptr = local_80.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
        if ((0xfffffff4 < (uint)JVar9.tag) &&
           (iVar1 = *JVar9.u.ptr, *(int *)JVar9.u.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar9);
        }
      }
    }
    goto LAB_0013004e;
  }
  pJVar2 = (JSValueUnion *)get_proxy_method(ctx,(JSValue *)&local_80,func_obj,0x5e);
  if (pJVar2 == (JSValueUnion *)0x0) {
LAB_00130045:
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
    uVar6 = 0;
  }
  else {
    local_68 = (JSValueUnion)pJVar2->ptr;
    if ((pJVar2[1].int32 != -1) || ((*(byte *)((long)local_68.ptr + 5) & 0x10) == 0)) {
      JS_ThrowTypeError(ctx,"not a constructor");
      goto LAB_00130045;
    }
    if ((uint)local_78 == 3) {
      JVar7 = JS_CallConstructorInternal(ctx,*(JSValue *)pJVar2,this_obj,argc,argv,2);
      uVar6 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
    }
    else {
      JVar9 = js_create_array(ctx,argc,argv);
      v_01.tag = JVar9.tag;
      if ((uint)JVar9.tag == 6) {
        JVar7 = (JSValue)(ZEXT816(6) << 0x40);
        uVar6 = 0;
        JVar4 = JVar9.u;
      }
      else {
        local_68.ptr = *(void **)pJVar2;
        JStack_60 = pJVar2[1];
        local_90 = local_90 & 0xffffffff00000000;
        new_target_01.tag._0_4_ = 3;
        new_target_01.u.ptr = (void *)local_90;
        new_target_01.tag._4_4_ = 0;
        func_obj_01.tag = local_78;
        func_obj_01.u.ptr = local_80.ptr;
        local_70 = JVar9.u;
        local_58 = JVar9;
        local_48 = this_obj;
        JVar7 = JS_CallInternal(ctx,func_obj_01,*(JSValue *)(pJVar2 + 2),new_target_01,3,
                                (JSValue *)&local_68,2);
        JVar3 = JVar7.u;
        uVar6 = (ulong)JVar3.ptr & 0xffffffff00000000;
        uVar5 = (uint)JVar7.tag;
        JVar4 = local_70;
        if ((uVar5 != 0xffffffff) && (uVar5 != 6)) {
          if ((0xfffffff4 < uVar5) &&
             (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar7);
          }
          JS_ThrowTypeError(ctx,"not an object");
          uVar6 = 0;
          JVar7 = (JSValue)(ZEXT816(6) << 0x40);
          JVar4 = local_70;
        }
      }
      if ((0xfffffff4 < (uint)local_78) &&
         (iVar1 = *local_80.ptr, *(int *)local_80.ptr = iVar1 + -1, iVar1 < 2)) {
        v_00.tag = local_78;
        v_00.u.ptr = local_80.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
      }
      if ((0xfffffff4 < (uint)JVar9.tag) &&
         (iVar1 = *JVar4.ptr, *(int *)JVar4.ptr = iVar1 + -1, iVar1 < 2)) {
        v_01.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_01);
      }
    }
  }
  JVar7.tag = JVar7.tag;
  JVar7.u.float64 = JVar7.u.float64 | uVar6;
LAB_0013004e:
  JVar8.tag = JVar7.tag;
  JVar8.u.ptr = (void *)((ulong)JVar7.u.ptr & 0xffffffff | uVar6);
  return JVar8;
}

Assistant:

static JSValue js_proxy_call(JSContext *ctx, JSValueConst func_obj,
                             JSValueConst this_obj,
                             int argc, JSValueConst *argv, int flags)
{
    JSProxyData *s;
    JSValue method, arg_array, ret;
    JSValueConst args[3];

    if (flags & JS_CALL_FLAG_CONSTRUCTOR)
        return js_proxy_call_constructor(ctx, func_obj, this_obj, argc, argv);
    
    s = get_proxy_method(ctx, &method, func_obj, JS_ATOM_apply);
    if (!s)
        return JS_EXCEPTION;
    if (!s->is_func) {
        JS_FreeValue(ctx, method);
        return JS_ThrowTypeError(ctx, "not a function");
    }
    if (JS_IsUndefined(method))
        return JS_Call(ctx, s->target, this_obj, argc, argv);
    arg_array = js_create_array(ctx, argc, argv);
    if (JS_IsException(arg_array)) {
        ret = JS_EXCEPTION;
        goto fail;
    }
    args[0] = s->target;
    args[1] = this_obj;
    args[2] = arg_array;
    ret = JS_Call(ctx, method, s->handler, 3, args);
 fail:
    JS_FreeValue(ctx, method);
    JS_FreeValue(ctx, arg_array);
    return ret;
}